

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O2

void __thiscall
asio::detail::posix_event::
unlock_and_signal_one<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  ulong uVar1;
  
  if (lock->locked_ == false) {
    __assert_fail("lock.locked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/thirdparty/asio/detail/posix_event.hpp"
                  ,0x41,
                  "void asio::detail::posix_event::unlock_and_signal_one(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
                 );
  }
  uVar1 = this->state_;
  this->state_ = uVar1 | 1;
  scoped_lock<asio::detail::posix_mutex>::unlock(lock);
  if (1 < uVar1) {
    pthread_cond_signal((pthread_cond_t *)this);
    return;
  }
  return;
}

Assistant:

void unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    bool have_waiters = (state_ > 1);
    lock.unlock();
    if (have_waiters)
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
  }